

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pgraph_class_ctx.cc
# Opt level: O2

void __thiscall hwtest::pgraph::MthdCtxFormat::emulate_mthd(MthdCtxFormat *this)

{
  pgraph_state *state;
  uint uVar1;
  uint32_t uVar2;
  sbyte sVar3;
  uint32_t uVar4;
  uint uVar5;
  
  uVar1 = (this->super_SingleMthdTest).super_MthdTest.val & 3;
  uVar2 = 0;
  if (uVar1 == 1) {
    uVar4 = (this->super_SingleMthdTest).super_MthdTest.cls;
    uVar2 = 0xb;
    if (uVar4 != 0x44) {
      uVar2 = (uint)(uVar4 == 0x57) * 9 + 2;
    }
  }
  uVar4 = 8;
  if (uVar1 != 2) {
    uVar4 = uVar2;
  }
  uVar2 = 0xd;
  if (uVar1 != 3) {
    uVar2 = uVar4;
  }
  state = &(this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp;
  pgraph_grobj_set_color_format(state,(this->super_SingleMthdTest).super_MthdTest.egrobj,uVar2);
  uVar2 = (this->super_SingleMthdTest).super_MthdTest.cls;
  if (uVar2 == 0x57) {
LAB_001acd30:
    uVar1 = (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.ctx_format;
    uVar2 = pgraph_grobj_get_color_format(state);
    (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.ctx_format =
         uVar2 << 0x18 | uVar1 & 0xffffff;
    uVar2 = (this->super_SingleMthdTest).super_MthdTest.cls;
  }
  else if (uVar2 == 0x17) {
    if ((this->super_SingleMthdTest).super_MthdTest.super_StateTest.super_RepeatTest.super_Test.
        chipset.card_type < 0x40) {
      return;
    }
    goto LAB_001acd30;
  }
  if (uVar2 == 0x57) {
    uVar1 = 0x20000;
    sVar3 = 0x10;
    uVar5 = 0xfffdffff;
    goto LAB_001acdd9;
  }
  if (uVar2 == 0x44) {
LAB_001acd70:
    uVar1 = (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.ctx_format;
    uVar2 = pgraph_grobj_get_color_format(state);
    uVar5 = (uVar2 & 0xff) << 8;
    (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.ctx_format =
         uVar5 | uVar1 & 0xffff00ff;
    uVar2 = pgraph_grobj_get_color_format(state);
    (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.ctx_format =
         (uVar2 & 0xff) << 0x10 | uVar5 | uVar1 & 0xff0000ff;
    uVar2 = (this->super_SingleMthdTest).super_MthdTest.cls;
  }
  else if (uVar2 == 0x18) {
    if ((this->super_SingleMthdTest).super_MthdTest.super_StateTest.super_RepeatTest.super_Test.
        chipset.card_type < 0x40) {
      return;
    }
    goto LAB_001acd70;
  }
  if (uVar2 != 0x44) {
    return;
  }
  uVar1 = 0x100000;
  sVar3 = 0x13;
  uVar5 = 0xffefffff;
LAB_001acdd9:
  (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.ctx_valid =
       ((this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.nsource << sVar3 & uVar1 |
       uVar5 & (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.ctx_valid) ^ uVar1;
  return;
}

Assistant:

void emulate_mthd() override {
		int sfmt = val & 3;
		int fmt = 0;
		if (sfmt == 1) {
			if (cls == 0x44 || cls == 0x57)
				fmt = 0xb;
			else
				fmt = 0x2;
		}
		if (sfmt == 2)
			fmt = 0x8;
		if (sfmt == 3)
			fmt = 0xd;
		pgraph_grobj_set_color_format(&exp, egrobj, fmt);
		if (cls == 0x57 || (cls == 0x17 && chipset.card_type >= 0x40)) {
			insrt(exp.ctx_format, 24, 8, pgraph_grobj_get_color_format(&exp));
		}
		if (cls == 0x57) {
			insrt(exp.ctx_valid, 17, 1, !extr(exp.nsource, 1, 1));
		}
		if (cls == 0x44 || (cls == 0x18 && chipset.card_type >= 0x40)) {
			insrt(exp.ctx_format, 8, 8, pgraph_grobj_get_color_format(&exp));
			insrt(exp.ctx_format, 16, 8, pgraph_grobj_get_color_format(&exp));
		}
		if (cls == 0x44) {
			insrt(exp.ctx_valid, 20, 1, !extr(exp.nsource, 1, 1));
		}
	}